

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_coin_selection.cpp
# Opt level: O0

void __thiscall
CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test::TestBody
          (CoinSelection_SelectCoins_SelectCoinsBnB_empty_with_asset_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  char *pcVar5;
  size_type sVar6;
  size_type sVar7;
  size_type sVar8;
  mapped_type_conflict *pmVar9;
  char *in_R9;
  Amount AVar10;
  void *in_stack_00000058;
  string *in_stack_00000060;
  Amount *in_stack_00000068;
  string *in_stack_00000070;
  uint32_t in_stack_0000007c;
  Txid *in_stack_00000080;
  Utxo *in_stack_00000090;
  Script *in_stack_00000098;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_7;
  UtxoFilter *in_stack_000001b0;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_000001b8;
  AmountMap *in_stack_000001c0;
  CoinSelection *in_stack_000001c8;
  AssertionResult gtest_ar_6;
  Amount *in_stack_000001e0;
  AmountMap *in_stack_000001e8;
  Amount *in_stack_000001f0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  *in_stack_000001f8;
  AmountMap *in_stack_00000200;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> select_utxos;
  CoinSelectionOption option_params;
  Txid txid;
  TestElementsUtxoCoinVector *test_data;
  const_iterator __end1;
  const_iterator __begin1;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *__range1;
  iterator ite;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> utxos;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  map_searched_bnb;
  Amount tx_fee;
  Amount fee;
  AmountMap map_select_value;
  AmountMap map_target_amount;
  CoinSelection coin_select;
  reference in_stack_fffffffffffffa88;
  CoinSelectionOption *in_stack_fffffffffffffa90;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffa98;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffaa0;
  char *in_stack_fffffffffffffaa8;
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *in_stack_fffffffffffffab0;
  key_type *in_stack_fffffffffffffac8;
  undefined7 in_stack_fffffffffffffad0;
  undefined1 in_stack_fffffffffffffad7;
  string local_460;
  AssertHelper local_440;
  Message local_438;
  string local_430;
  byte local_409;
  AssertionResult local_408;
  AssertHelper local_3f8;
  Message local_3f0;
  undefined4 local_3e4;
  size_type local_3e0;
  AssertionResult local_3d8;
  AssertHelper local_3c8;
  Message local_3c0;
  undefined4 local_3b4;
  int64_t local_3b0;
  AssertionResult local_3a8;
  AssertHelper local_398;
  Message local_390;
  undefined4 local_384;
  string local_380;
  AssertionResult local_360;
  AssertHelper local_350;
  Message local_348;
  undefined4 local_33c;
  size_type local_338;
  AssertionResult local_330;
  AssertHelper local_320;
  Message local_318;
  undefined8 local_310;
  AssertionResult local_308;
  AssertHelper local_2f8;
  Message local_2f0;
  undefined8 local_2e8;
  AssertionResult local_2e0;
  AssertHelper local_2d0;
  Message local_2c8;
  undefined8 local_2c0;
  AssertionResult local_2b8;
  AssertHelper local_2a8;
  Message local_2a0;
  undefined4 local_294;
  size_type local_290;
  AssertionResult local_288;
  AssertHelper local_278;
  Message local_270 [5];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_248;
  char local_230 [32];
  CoinSelectionOption *in_stack_fffffffffffffdf0;
  Txid local_1a8;
  Txid local_188;
  reference local_168;
  TestElementsUtxoCoinVector *local_160;
  __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
  local_158;
  vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *local_150;
  __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_> local_148 [4];
  vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> local_128 [2];
  uint64_t local_f8;
  undefined1 local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [80];
  string local_88 [4];
  
  cfd::CoinSelection::CoinSelection
            ((CoinSelection *)in_stack_fffffffffffffa90,
             SUB81((ulong)in_stack_fffffffffffffa88 >> 0x38,0));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27ce8e);
  cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(local_88,&exp_dummy_asset_a);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                         *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                        in_stack_fffffffffffffac8);
  *pmVar3 = 0x6cc1cc0;
  std::__cxx11::string::~string((string *)local_88);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
         *)0x27ceec);
  cfd::core::Amount::Amount((Amount *)local_d8);
  AVar10 = cfd::core::Amount::CreateBySatoshiAmount(0x5dc);
  local_f8 = AVar10.amount_;
  local_f0 = AVar10.ignore_check_;
  local_e8._0_8_ = local_f8;
  local_e8[8] = local_f0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
         *)0x27cf5f);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27cf74);
  std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::size
            (&kExtCoinSelectElementsTestVector);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::resize
            (in_stack_fffffffffffffab0,(size_type)in_stack_fffffffffffffaa8);
  local_148[0]._M_current =
       (Utxo *)std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::begin
                         ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)in_stack_fffffffffffffa88
                         );
  local_150 = &kExtCoinSelectElementsTestVector;
  local_158._M_current =
       (TestElementsUtxoCoinVector *)
       std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::begin
                 ((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffffa88);
  local_160 = (TestElementsUtxoCoinVector *)
              std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>::
              end((vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_> *
                  )in_stack_fffffffffffffa88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffa90,
                            (__normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                             *)in_stack_fffffffffffffa88), bVar1) {
    local_168 = __gnu_cxx::
                __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
                ::operator*(&local_158);
    cfd::core::Txid::Txid(&local_188);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      cfd::core::Txid::Txid(&local_1a8,&local_168->txid);
      cfd::core::Txid::operator=(&local_188,&local_1a8);
      cfd::core::Txid::~Txid((Txid *)0x27d070);
    }
    cfd::core::Amount::CreateBySatoshiAmount(local_168->amount);
    in_stack_fffffffffffffa88 =
         __gnu_cxx::
         __normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
         operator*(local_148);
    in_stack_fffffffffffffa90 = (CoinSelectionOption *)0x0;
    in_R9 = (char *)0x0;
    cfd::CoinSelection::ConvertToUtxo
              (in_stack_00000080,in_stack_0000007c,in_stack_00000070,in_stack_00000068,
               in_stack_00000060,in_stack_00000058,in_stack_00000090,in_stack_00000098);
    __gnu_cxx::__normal_iterator<cfd::Utxo_*,_std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>_>::
    operator++(local_148);
    cfd::core::Txid::~Txid((Txid *)0x27d21b);
    __gnu_cxx::
    __normal_iterator<const_TestElementsUtxoCoinVector_*,_std::vector<TestElementsUtxoCoinVector,_std::allocator<TestElementsUtxoCoinVector>_>_>
    ::operator++(&local_158);
  }
  cfd::CoinSelectionOption::CoinSelectionOption(in_stack_fffffffffffffa90);
  cfd::CoinSelectionOption::InitializeConfidentialTxSizeInfo(in_stack_fffffffffffffdf0);
  cfd::CoinSelectionOption::SetEffectiveFeeBaserate
            (in_stack_fffffffffffffa90,(double)in_stack_fffffffffffffa88);
  cfd::CoinSelectionOption::SetFeeAsset
            (in_stack_fffffffffffffa90,(ConfidentialAssetId *)in_stack_fffffffffffffa88);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::vector
            ((vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)0x27d297);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      in_stack_fffffffffffffaa0 = local_128;
      in_stack_fffffffffffffa98 = (vector<cfd::Utxo,_std::allocator<cfd::Utxo>_> *)local_d8;
      in_stack_fffffffffffffa90 = (CoinSelectionOption *)(local_d8 + 0x10);
      in_stack_fffffffffffffa88 = (reference)local_e8;
      in_stack_fffffffffffffaa8 = (char *)0x0;
      in_R9 = local_230;
      cfd::CoinSelection::SelectCoins
                (in_stack_000001c8,in_stack_000001c0,in_stack_000001b8,in_stack_000001b0,
                 (CoinSelectionOption *)gtest_ar_7.message_.ptr_,in_stack_000001e0,in_stack_000001e8
                 ,in_stack_000001f0,in_stack_000001f8,in_stack_00000200);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator=
                (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98);
      std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffaa0);
    }
  }
  else {
    testing::Message::Message(local_270);
    testing::internal::AssertHelper::AssertHelper
              (&local_278,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4a3,
               "Expected: (select_utxos = coin_select.SelectCoins(map_target_amount, utxos, exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_278,local_270);
    testing::internal::AssertHelper::~AssertHelper(&local_278);
    testing::Message::~Message((Message *)0x27d43e);
  }
  local_290 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_248);
  local_294 = 3;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
             (unsigned_long *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_288);
  if (!bVar1) {
    testing::Message::Message(&local_2a0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27d533);
    testing::internal::AssertHelper::AssertHelper
              (&local_2a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4a4,pcVar5);
    testing::internal::AssertHelper::operator=(&local_2a8,&local_2a0);
    testing::internal::AssertHelper::~AssertHelper(&local_2a8);
    testing::Message::~Message((Message *)0x27d596);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27d5ee);
  sVar6 = std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::size(&local_248);
  if (sVar6 == 3) {
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_248,0);
    local_2c0 = 0x3a3bd64;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
               (unsigned_long *)in_stack_fffffffffffffa98,(long *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2b8);
    if (!bVar1) {
      testing::Message::Message(&local_2c8);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27d6bd);
      testing::internal::AssertHelper::AssertHelper
                (&local_2d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4a6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
      testing::internal::AssertHelper::~AssertHelper(&local_2d0);
      testing::Message::~Message((Message *)0x27d720);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27d775);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_248,1);
    local_2e8 = 0x2540be4;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
               (unsigned_long *)in_stack_fffffffffffffa98,(long *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2e0);
    if (!bVar1) {
      testing::Message::Message(&local_2f0);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27d82e);
      testing::internal::AssertHelper::AssertHelper
                (&local_2f8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4a7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_2f8,&local_2f0);
      testing::internal::AssertHelper::~AssertHelper(&local_2f8);
      testing::Message::~Message((Message *)0x27d891);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27d8e6);
    std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::operator[](&local_248,2);
    local_310 = 0xe3f1de;
    testing::internal::EqHelper<false>::Compare<unsigned_long,long>
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
               (unsigned_long *)in_stack_fffffffffffffa98,(long *)in_stack_fffffffffffffa90);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_308);
    if (!bVar1) {
      testing::Message::Message(&local_318);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27d99f);
      testing::internal::AssertHelper::AssertHelper
                (&local_320,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4a8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_320,&local_318);
      testing::internal::AssertHelper::~AssertHelper(&local_320);
      testing::Message::~Message((Message *)0x27da02);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27da57);
  }
  local_338 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                      *)0x27da78);
  local_33c = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
             (unsigned_long *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_330);
  if (!bVar1) {
    testing::Message::Message(&local_348);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27db15);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4aa,pcVar5);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    testing::Message::~Message((Message *)0x27db78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27dbd0);
  sVar7 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)0x27dbdd);
  if (sVar7 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_380,&exp_dummy_asset_a);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
                  *)CONCAT17(in_stack_fffffffffffffad7,in_stack_fffffffffffffad0),
                 in_stack_fffffffffffffac8);
    local_384 = 0x6dbbb26;
    testing::internal::EqHelper<false>::Compare<long,int>
              (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
               (long *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
    std::__cxx11::string::~string((string *)&local_380);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_360);
    if (!bVar1) {
      testing::Message::Message(&local_390);
      pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27dcea);
      testing::internal::AssertHelper::AssertHelper
                (&local_398,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4ac,pcVar5);
      testing::internal::AssertHelper::operator=(&local_398,&local_390);
      testing::internal::AssertHelper::~AssertHelper(&local_398);
      testing::Message::~Message((Message *)0x27dd47);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27dd9c);
  }
  local_3b0 = cfd::core::Amount::GetSatoshiValue((Amount *)local_d8);
  local_3b4 = 0x114;
  testing::internal::EqHelper<false>::Compare<long,int>
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
             (long *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3a8);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    pcVar5 = testing::AssertionResult::failure_message((AssertionResult *)0x27de60);
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4ae,pcVar5);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    testing::Message::~Message((Message *)0x27debd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27df12);
  local_3e0 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
              ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                      *)0x27df1f);
  local_3e4 = 1;
  testing::internal::EqHelper<false>::Compare<unsigned_long,int>
            (in_stack_fffffffffffffaa8,(char *)in_stack_fffffffffffffaa0,
             (unsigned_long *)in_stack_fffffffffffffa98,(int *)in_stack_fffffffffffffa90);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_3d8);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_3f0);
    in_stack_fffffffffffffac8 =
         (key_type *)testing::AssertionResult::failure_message((AssertionResult *)0x27dfc8);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
               ,0x4af,(char *)in_stack_fffffffffffffac8);
    testing::internal::AssertHelper::operator=(&local_3f8,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    testing::Message::~Message((Message *)0x27e025);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e07d);
  sVar8 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          ::size((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                  *)0x27e08a);
  if (sVar8 == 1) {
    cfd::core::ConfidentialAssetId::GetHex_abi_cxx11_(&local_430,&exp_dummy_asset_a);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
                           *)CONCAT17(uVar2,in_stack_fffffffffffffad0),in_stack_fffffffffffffac8);
    local_409 = ~*pmVar9 & 1;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)in_stack_fffffffffffffa90,(bool *)in_stack_fffffffffffffa88,
               (type *)0x27e0f1);
    std::__cxx11::string::~string((string *)&local_430);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_408);
    if (!bVar1) {
      testing::Message::Message(&local_438);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_460,(internal *)&local_408,
                 (AssertionResult *)"map_searched_bnb[exp_dummy_asset_a.GetHex()]","true","false",
                 in_R9);
      pcVar5 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_440,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/test_cfd_coin_selection.cpp"
                 ,0x4b1,pcVar5);
      testing::internal::AssertHelper::operator=(&local_440,&local_438);
      testing::internal::AssertHelper::~AssertHelper(&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      testing::Message::~Message((Message *)0x27e21c);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x27e294);
  }
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffaa0);
  cfd::CoinSelectionOption::~CoinSelectionOption((CoinSelectionOption *)0x27e2bf);
  std::vector<cfd::Utxo,_std::allocator<cfd::Utxo>_>::~vector(in_stack_fffffffffffffaa0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>
          *)0x27e2d9);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27e2e6);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>_>_>
          *)0x27e2f3);
  cfd::CoinSelection::~CoinSelection((CoinSelection *)0x27e300);
  return;
}

Assistant:

TEST(CoinSelection, SelectCoins_SelectCoinsBnB_empty_with_asset)
{
  CoinSelection coin_select(true);
  AmountMap map_target_amount;
  map_target_amount[exp_dummy_asset_a.GetHex()] = 114040000;
  AmountMap map_select_value;
  Amount fee;
  Amount tx_fee = Amount::CreateBySatoshiAmount(1500);
  std::map<std::string, bool> map_searched_bnb;

  std::vector<Utxo> utxos;
  utxos.resize(kExtCoinSelectElementsTestVector.size());
  std::vector<Utxo>::iterator ite = utxos.begin();
  for (const auto& test_data : kExtCoinSelectElementsTestVector) {
    Txid txid;
    if (!test_data.txid.empty()) {
      txid = Txid(test_data.txid);
    }
    CoinSelection::ConvertToUtxo(
        txid, test_data.vout, test_data.descriptor,
        Amount::CreateBySatoshiAmount(test_data.amount), test_data.asset,
        nullptr, &(*ite));
    ++ite;
  }

  CoinSelectionOption option_params;
  option_params.InitializeConfidentialTxSizeInfo();
  option_params.SetEffectiveFeeBaserate(1);
  option_params.SetFeeAsset(exp_dummy_asset_a);

  std::vector<Utxo> select_utxos;
  EXPECT_NO_THROW((select_utxos = coin_select.SelectCoins(map_target_amount, utxos,
      exp_filter, option_params, tx_fee, &map_select_value, &fee, &map_searched_bnb)));
  EXPECT_EQ(select_utxos.size(), 3);
  if (select_utxos.size() == 3) {
    EXPECT_EQ(select_utxos[0].amount, static_cast<int64_t>(61062500));
    EXPECT_EQ(select_utxos[1].amount, static_cast<int64_t>(39062500));
    EXPECT_EQ(select_utxos[2].amount, static_cast<int64_t>(14938590));
  }
  EXPECT_EQ(map_select_value.size(), 1);
  if (map_select_value.size() == 1) {
    EXPECT_EQ(map_select_value[exp_dummy_asset_a.GetHex()], 115063590);
  }
  EXPECT_EQ(fee.GetSatoshiValue(), 276);
  EXPECT_EQ(map_searched_bnb.size(), 1);
  if (map_searched_bnb.size() == 1) {
    EXPECT_FALSE(map_searched_bnb[exp_dummy_asset_a.GetHex()]);
  }
}